

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O3

int mbedtls_ecdhopt_read_responder(mbedtls_ecdhopt_context *ctx,uchar *buf,size_t blen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  
  if (ctx->curve == MBEDTLS_ECP_DP_CURVE25519) {
    iVar4 = -0x4f00;
    if ((0x20 < blen) && (iVar4 = -0x4f80, *buf == ' ')) {
      uVar1 = *(undefined8 *)(buf + 1);
      uVar2 = *(undefined8 *)(buf + 9);
      uVar3 = *(undefined8 *)(buf + 0x19);
      *(undefined8 *)((long)&ctx->ctx + 0x30) = *(undefined8 *)(buf + 0x11);
      *(undefined8 *)((long)&ctx->ctx + 0x38) = uVar3;
      *(undefined8 *)((long)&ctx->ctx + 0x20) = uVar1;
      *(undefined8 *)((long)&ctx->ctx + 0x28) = uVar2;
      iVar4 = 0;
    }
    return iVar4;
  }
  iVar4 = mbedtls_ecdh_read_public(&(ctx->ctx).ec,buf,blen);
  return iVar4;
}

Assistant:

int mbedtls_ecdhopt_read_responder( mbedtls_ecdhopt_context *ctx,
                      const unsigned char *buf, size_t blen )
{
    if( ctx->curve == MBEDTLS_ECP_DP_CURVE25519 )
    {
        if( blen < 33 )
            return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );
        if( ( *buf++ != 32 ) )
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
        memcpy( ctx->ctx.x25519.peer_point, buf, 32 );
        return( 0 );
    }
    else
    {
        return mbedtls_ecdh_read_public( &ctx->ctx.ec, buf, blen );
    }
}